

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Text_Display.cxx
# Opt level: O3

void __thiscall Fl_Text_Display::update_h_scrollbar(Fl_Text_Display *this)

{
  int iVar1;
  int iVar2;
  int iVar3;
  
  if (this->mNVisibleLines < 1) {
    iVar3 = 0;
  }
  else {
    iVar2 = 0;
    iVar3 = 0;
    do {
      iVar1 = measure_vline(this,iVar2);
      if (iVar3 <= iVar1) {
        iVar3 = iVar1;
      }
      iVar2 = iVar2 + 1;
    } while (iVar2 < this->mNVisibleLines);
  }
  iVar1 = (this->text_area).w;
  iVar2 = this->mHorizOffset + iVar1;
  if (iVar2 < iVar3) {
    iVar2 = iVar3;
  }
  Fl_Slider::scrollvalue(&this->mHScrollBar->super_Fl_Slider,this->mHorizOffset,iVar1,0,iVar2);
  return;
}

Assistant:

void Fl_Text_Display::update_h_scrollbar() {
  int sliderMax = max(longest_vline(), text_area.w + mHorizOffset);
  mHScrollBar->value( mHorizOffset, text_area.w, 0, sliderMax );
}